

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

int __thiscall zmq::router_t::xsend(router_t *this,msg_t *msg_)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  blob_t *this_00;
  size_t sVar4;
  out_pipe_t *poVar5;
  int *piVar6;
  char *pcVar7;
  ssize_t sVar8;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pipe_t *in_RSI;
  pipe_t *ppVar9;
  EVP_PKEY_CTX *ctx;
  blob_t *in_RDI;
  char *errstr_6;
  int rc;
  char *errstr_5;
  int rc_4;
  char *errstr_4;
  int rc_3;
  bool ok;
  char *errstr_3;
  char *errstr_2;
  int rc_2;
  char *errstr_1;
  char *errstr;
  int rc_1;
  bool pipe_full;
  out_pipe_t *out_pipe;
  pipe_t *in_stack_ffffffffffffff30;
  msg_t *in_stack_ffffffffffffff38;
  routing_socket_base_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 delay_;
  pipe_t *in_stack_ffffffffffffff70;
  pipe_t *in_stack_ffffffffffffff80;
  undefined1 local_38 [56];
  
  delay_ = (undefined1)((uint)in_stack_ffffffffffffff6c >> 0x18);
  local_38._32_8_ = in_RSI;
  if (((ulong)in_RDI[0x58]._data & 1) == 0) {
    if (*(long *)&in_RDI[0x57]._owned != 0) {
      pcVar7 = "Assertion failed: %s (%s:%d)\n";
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_current_out",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0xc1);
      fflush(_stderr);
      zmq_abort((char *)0x300c54);
      in_RSI = (pipe_t *)pcVar7;
    }
    bVar1 = msg_t::flags((msg_t *)local_38._32_8_);
    if ((bVar1 & 1) != 0) {
      *(undefined1 *)&in_RDI[0x58]._data = 1;
      this_00 = (blob_t *)msg_t::data(in_stack_ffffffffffffff38);
      sVar4 = msg_t::size(in_stack_ffffffffffffff38);
      in_RSI = (pipe_t *)local_38;
      blob_t::blob_t((blob_t *)in_RSI,this_00,sVar4);
      ppVar9 = in_RSI;
      poVar5 = routing_socket_base_t::lookup_out_pipe(in_stack_ffffffffffffff50,in_RDI);
      blob_t::~blob_t(this_00);
      local_38._24_8_ = poVar5;
      if (poVar5 == (out_pipe_t *)0x0) {
        if ((in_RDI[0x58]._size & 1) != 0) {
          *(undefined1 *)&in_RDI[0x58]._data = 0;
          piVar6 = __errno_location();
          *piVar6 = 0x71;
          return -1;
        }
      }
      else {
        *(pipe_t **)&in_RDI[0x57]._owned = poVar5->pipe;
        bVar2 = pipe_t::check_write(ppVar9);
        if (!bVar2) {
          bVar2 = pipe_t::check_hwm(*(pipe_t **)&in_RDI[0x57]._owned);
          *(bool *)(local_38._24_8_ + 8) = false;
          *(undefined8 *)&in_RDI[0x57]._owned = 0;
          if ((in_RDI[0x58]._size & 1) != 0) {
            *(undefined1 *)&in_RDI[0x58]._data = 0;
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              piVar6 = __errno_location();
              *piVar6 = 0x71;
            }
            else {
              piVar6 = __errno_location();
              *piVar6 = 0xb;
            }
            return -1;
          }
        }
      }
    }
    iVar3 = msg_t::close((msg_t *)local_38._32_8_,(int)in_RSI);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      in_RSI = (pipe_t *)0x32b5b5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0xeb);
      fflush(_stderr);
      zmq_abort((char *)0x300e82);
    }
    iVar3 = msg_t::init((msg_t *)local_38._32_8_,(EVP_PKEY_CTX *)in_RSI);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0xed);
      fflush(_stderr);
      zmq_abort((char *)0x300eff);
    }
  }
  else {
    ppVar9 = in_RSI;
    if ((in_RDI[0x10]._size & 0x1000000) != 0) {
      ppVar9 = (pipe_t *)0x1;
      msg_t::reset_flags((msg_t *)in_RSI,'\x01');
    }
    bVar1 = msg_t::flags((msg_t *)local_38._32_8_);
    bVar2 = (bVar1 & 1) != 0;
    __n = (size_t)bVar2;
    *(bool *)&in_RDI[0x58]._data = bVar2;
    if (*(long *)&in_RDI[0x57]._owned == 0) {
      iVar3 = msg_t::close((msg_t *)local_38._32_8_,(int)ppVar9);
      if (iVar3 != 0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        ppVar9 = (pipe_t *)0x32b5b5;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                ,0x118);
        fflush(_stderr);
        zmq_abort((char *)0x301222);
      }
    }
    else {
      __buf = extraout_RDX;
      if (((in_RDI[0x58]._size & 0x100) != 0) &&
         (sVar4 = msg_t::size(in_stack_ffffffffffffff38), __buf = extraout_RDX_00, sVar4 == 0)) {
        ctx = (EVP_PKEY_CTX *)0x0;
        pipe_t::terminate(in_stack_ffffffffffffff70,(bool)delay_);
        iVar3 = msg_t::close((msg_t *)local_38._32_8_,(int)ctx);
        if (iVar3 != 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          ctx = (EVP_PKEY_CTX *)0x32b5b5;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                  ,0x100);
          fflush(_stderr);
          zmq_abort((char *)0x301019);
        }
        iVar3 = msg_t::init((msg_t *)local_38._32_8_,ctx);
        if (iVar3 != 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                  ,0x102);
          fflush(_stderr);
          zmq_abort((char *)0x301090);
        }
        *(undefined8 *)&in_RDI[0x57]._owned = 0;
        return 0;
      }
      ppVar9 = (pipe_t *)local_38._32_8_;
      sVar8 = pipe_t::write(*(pipe_t **)&in_RDI[0x57]._owned,(int)local_38._32_8_,__buf,__n);
      if ((((byte)sVar8 & 1 ^ 0xff) & 1) == 0) {
        if (((ulong)in_RDI[0x58]._data & 1) == 0) {
          pipe_t::flush(in_stack_ffffffffffffff30);
          *(undefined8 *)&in_RDI[0x57]._owned = 0;
        }
      }
      else {
        iVar3 = msg_t::close((msg_t *)local_38._32_8_,(int)ppVar9);
        if (iVar3 != 0) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          ppVar9 = (pipe_t *)0x32b5b5;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                  ,0x10b);
          fflush(_stderr);
          zmq_abort((char *)0x301155);
        }
        pipe_t::rollback(in_stack_ffffffffffffff80);
        *(undefined8 *)&in_RDI[0x57]._owned = 0;
      }
    }
    iVar3 = msg_t::init((msg_t *)local_38._32_8_,(EVP_PKEY_CTX *)ppVar9);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x11d);
      fflush(_stderr);
      zmq_abort((char *)0x30129b);
    }
  }
  return 0;
}

Assistant:

int zmq::router_t::xsend (msg_t *msg_)
{
    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        zmq_assert (!_current_out);

        //  If we have malformed message (prefix with no subsequent message)
        //  then just silently ignore it.
        //  TODO: The connections should be killed instead.
        if (msg_->flags () & msg_t::more) {
            _more_out = true;

            //  Find the pipe associated with the routing id stored in the prefix.
            //  If there's no such pipe just silently ignore the message, unless
            //  router_mandatory is set.
            out_pipe_t *out_pipe = lookup_out_pipe (
              blob_t (static_cast<unsigned char *> (msg_->data ()),
                      msg_->size (), zmq::reference_tag_t ()));

            if (out_pipe) {
                _current_out = out_pipe->pipe;

                // Check whether pipe is closed or not
                if (!_current_out->check_write ()) {
                    // Check whether pipe is full or not
                    const bool pipe_full = !_current_out->check_hwm ();
                    out_pipe->active = false;
                    _current_out = NULL;

                    if (_mandatory) {
                        _more_out = false;
                        if (pipe_full)
                            errno = EAGAIN;
                        else
                            errno = EHOSTUNREACH;
                        return -1;
                    }
                }
            } else if (_mandatory) {
                _more_out = false;
                errno = EHOSTUNREACH;
                return -1;
            }
        }

        int rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    //  Ignore the MORE flag for raw-sock or assert?
    if (options.raw_socket)
        msg_->reset_flags (msg_t::more);

    //  Check whether this is the last part of the message.
    _more_out = (msg_->flags () & msg_t::more) != 0;

    //  Push the message into the pipe. If there's no out pipe, just drop it.
    if (_current_out) {
        // Close the remote connection if user has asked to do so
        // by sending zero length message.
        // Pending messages in the pipe will be dropped (on receiving term- ack)
        if (_raw_socket && msg_->size () == 0) {
            _current_out->terminate (false);
            int rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            _current_out = NULL;
            return 0;
        }

        const bool ok = _current_out->write (msg_);
        if (unlikely (!ok)) {
            // Message failed to send - we must close it ourselves.
            const int rc = msg_->close ();
            errno_assert (rc == 0);
            // HWM was checked before, so the pipe must be gone. Roll back
            // messages that were piped, for example REP labels.
            _current_out->rollback ();
            _current_out = NULL;
        } else {
            if (!_more_out) {
                _current_out->flush ();
                _current_out = NULL;
            }
        }
    } else {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
    }

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}